

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_bound.cpp
# Opt level: O3

ostream * despot::operator<<(ostream *os,ValuedAction *va)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  poVar1 = (ostream *)std::ostream::operator<<(os,va->action);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>(va->value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const ValuedAction& va) {
	os << "(" << va.action << ", " << va.value << ")";
	return os;
}